

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestCustomValueOptions_Test::
TestBody(DescriptorPoolTypeResolverTest_TestCustomValueOptions_Test *this)

{
  bool bVar1;
  pointer pTVar2;
  char *pcVar3;
  EnumValue *this_00;
  RepeatedPtrField<google::protobuf::Option> *options;
  char *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar4;
  char *in_R9;
  string_view full_name;
  string_view name;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  string_view local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  size_t local_120;
  EnumValue *value;
  string local_108;
  AssertHelper local_e8;
  Message local_e0 [3];
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  string local_b8;
  Status local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  Enum type;
  DescriptorPoolTypeResolverTest_TestCustomValueOptions_Test *this_local;
  
  Enum::Enum((Enum *)&gtest_ar_.message_);
  pTVar2 = std::
           unique_ptr<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ::operator->(&(this->super_DescriptorPoolTypeResolverTest).resolver_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,"proto2_unittest.TestMessageWithCustomOptions.AnEnum");
  full_name._M_str = in_RCX;
  full_name._M_len = (size_t)local_c8._M_str;
  util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
            (&local_b8,(_anonymous_namespace_ *)local_c8._M_len,full_name);
  puVar4 = &gtest_ar_.message_;
  (*pTVar2->_vptr_TypeResolver[3])(&local_98,pTVar2,&local_b8);
  local_89 = absl::lts_20250127::Status::ok(&local_98);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(internal *)local_88,
               (AssertionResult *)
               "resolver_ ->ResolveEnumType( GetTypeUrl(\"proto2_unittest.TestMessageWithCustomOptions.AnEnum\"), &type) .ok()"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    puVar4 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x18d;
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,
               "ANENUM_VAL2");
    name._M_str = (char *)puVar4;
    name._M_len = local_120;
    this_00 = FindEnumValue((anon_unknown_0 *)&gtest_ar_.message_,
                            (Enum *)gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl,name);
    local_139 = this_00 != (EnumValue *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_138,&local_139,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_138,(AssertionResult *)0x1dcf74a,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,399,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    if (bVar1) {
      options = EnumValue::options(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_198,"proto2_unittest.enum_value_opt1");
      local_181 = HasInt32Option(options,local_198,0x7b);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_180,&local_181,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1c8,(internal *)local_180,
                   (AssertionResult *)
                   "HasInt32Option(value->options(), \"proto2_unittest.enum_value_opt1\", 123)",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                   ,0x191,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        testing::Message::~Message(&local_1a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    }
  }
  Enum::~Enum((Enum *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestCustomValueOptions) {
  Enum type;
  ASSERT_TRUE(
      resolver_
          ->ResolveEnumType(
              GetTypeUrl("proto2_unittest.TestMessageWithCustomOptions.AnEnum"),
              &type)
          .ok());
  const EnumValue* value = FindEnumValue(type, "ANENUM_VAL2");
  ASSERT_TRUE(value != nullptr);
  ASSERT_TRUE(
      HasInt32Option(value->options(), "proto2_unittest.enum_value_opt1", 123));
}